

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O2

void make_data(uint32_t spanlen,uint32_t intvlen,double density,order_t order,uint32_t **offsets_out
              ,uint32_t *count_out)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  pcg32_random_t *rng;
  uint32_t i_1;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  dVar9 = floor((density * (double)spanlen) / (double)intvlen);
  uVar3 = (ulong)dVar9;
  uVar8 = uVar3 & 0xffffffff;
  rng = (pcg32_random_t *)(uVar8 * 4);
  puVar4 = (uint32_t *)malloc((size_t)rng);
  lVar7 = 0;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = pcg32_random_r(rng);
    puVar4[uVar6] = uVar1;
    lVar7 = lVar7 + (ulong)uVar1;
  }
  auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar10._0_8_ = lVar7;
  auVar10._12_4_ = 0x45300000;
  uVar5 = (uint)uVar3;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    dVar9 = floor(((double)puVar4[uVar6] /
                  ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0))) *
                  ((double)(spanlen - uVar5 * intvlen) / (double)intvlen));
    uVar1 = (uint32_t)(long)dVar9;
    if (uVar6 != 0) {
      uVar1 = uVar1 + intvlen + puVar4[uVar6 - 1];
    }
    puVar4[uVar6] = uVar1;
  }
  if (order == DESC) {
    uVar2 = uVar5;
    for (uVar6 = 0; uVar2 = uVar2 - 1, (uVar3 >> 1 & 0x7fffffff) != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = puVar4[uVar6];
      puVar4[uVar6] = puVar4[uVar2];
      puVar4[uVar2] = uVar1;
    }
  }
  else if (order == SHUFFLE) {
    while (1 < uVar8) {
      uVar1 = pcg32_random();
      uVar3 = (ulong)uVar1;
      uVar2 = (uint)uVar8 - 1;
      if (((uint)uVar8 & uVar2) == 0) {
        uVar3 = (ulong)(uVar1 & uVar2);
      }
      else if (uVar8 < 0x80000001) {
        uVar3 = uVar3 * uVar8;
        if ((uVar3 & 0xffffffff) < uVar8) {
          while ((uint)uVar3 <= (uint)(0xffffffff % (uVar8 & 0xffffffff))) {
            uVar1 = pcg32_random();
            uVar3 = uVar1 * uVar8;
          }
        }
        uVar3 = uVar3 >> 0x20;
      }
      else {
        while (uVar8 <= uVar3) {
          uVar1 = pcg32_random();
          uVar3 = (ulong)uVar1;
        }
      }
      uVar8 = uVar8 - 1;
      uVar1 = puVar4[uVar8 & 0xffffffff];
      puVar4[uVar8 & 0xffffffff] = puVar4[uVar3];
      puVar4[uVar3] = uVar1;
    }
  }
  *offsets_out = puVar4;
  *count_out = uVar5;
  return;
}

Assistant:

void make_data(uint32_t spanlen, uint32_t intvlen, double density,
               order_t order, uint32_t **offsets_out, uint32_t *count_out) {
    uint32_t count = floor(spanlen * density / intvlen);
    uint32_t *offsets = malloc(count * sizeof(uint32_t));

    uint64_t sum = 0;
    for (uint32_t i = 0; i < count; i++) {
        offsets[i] = pcg32_random_r(&pcg32_global);
        sum += offsets[i];
    }
    for (uint32_t i = 0; i < count; i++) {
        double v = offsets[i];
        v /= sum;
        v *= (spanlen - count * intvlen) / (double)intvlen;
        uint32_t gap = floor(v);

        if (i == 0) {
            offsets[i] = gap;
        } else {
            offsets[i] = offsets[i - 1] + intvlen + gap;
        }
    }

    if (order == SHUFFLE) {
        shuffle_uint32(offsets, count);
    } else if (order == DESC) {
        for (uint32_t i = 0, j = count - 1; i < count / 2; i++, j--) {
            uint32_t tmp = offsets[i];
            offsets[i] = offsets[j];
            offsets[j] = tmp;
        }
    }

    *offsets_out = offsets;
    *count_out = count;
}